

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayingState.cpp
# Opt level: O2

void PlayingState::CmdAdvancedPrompt
               (string *input,shared_ptr<Connection> *connection,shared_ptr<GameData> *game_data)

{
  Connection *pCVar1;
  bool bVar2;
  ostream *poVar3;
  string *this;
  shared_ptr<Player> player;
  string local_1e8 [32];
  string local_1c8 [32];
  stringstream ss;
  ostream local_198 [376];
  
  Connection::GetPlayer((Connection *)&player);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::operator<<(local_198,"Advanced Prompt ");
  bVar2 = std::operator==(input,"off");
  pCVar1 = (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (bVar2) {
    Connection::AdvancedPrompt(pCVar1,false);
    poVar3 = std::operator<<(local_198,"off");
    std::operator<<(poVar3,(string *)&Format::NL_abi_cxx11_);
    this = local_1c8;
    std::__cxx11::stringbuf::str();
    (**((player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Entity).
       _vptr_Entity)(player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this);
  }
  else {
    Connection::AdvancedPrompt(pCVar1,true);
    poVar3 = std::operator<<(local_198,"on");
    std::operator<<(poVar3,(string *)&Format::NL_abi_cxx11_);
    this = local_1e8;
    std::__cxx11::stringbuf::str();
    (**((player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Entity).
       _vptr_Entity)(player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr,this);
  }
  std::__cxx11::string::~string(this);
  pCVar1 = (connection->super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  bVar2 = std::operator!=(input,"off");
  Connection::AdvancedPrompt(pCVar1,bVar2);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void PlayingState::CmdAdvancedPrompt(const std::string &input, std::shared_ptr<Connection> connection,
                                    std::shared_ptr<GameData> game_data) {
    auto player = connection->GetPlayer();
    std::stringstream ss;
    ss << "Advanced Prompt ";
    if(input == "off") {
        connection->AdvancedPrompt(false);
        ss << "off" << Format::NL;
        player->Send(ss.str());
    } else {
        connection->AdvancedPrompt(true);
        ss << "on" << Format::NL;
        player->Send(ss.str());
    }
    connection->AdvancedPrompt(input != "off");
}